

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O1

void Abc_FlowRetime_UpdateLags_back_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int iVar5;
  int in_EDX;
  int Fill;
  long lVar6;
  
  uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
  if (uVar4 != 5) {
    if (uVar4 == 8) {
      __assert_fail("!Abc_ObjIsLatch(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretMain.c"
                    ,0x4f2,"void Abc_FlowRetime_UpdateLags_back_rec(Abc_Obj_t *)");
    }
    if (uVar4 == 3) {
      __assert_fail("!Abc_ObjIsPo(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fret/fretMain.c"
                    ,0x4f1,"void Abc_FlowRetime_UpdateLags_back_rec(Abc_Obj_t *)");
    }
    pAVar2 = pObj->pNtk;
    iVar5 = pObj->Id;
    Vec_IntFillExtra(&pAVar2->vTravIds,iVar5 + 1,in_EDX);
    if (((long)iVar5 < 0) || ((pAVar2->vTravIds).nSize <= iVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar3 = pObj->pNtk;
    iVar1 = pAVar3->nTravIds;
    if ((pAVar2->vTravIds).pArray[iVar5] != iVar1) {
      iVar5 = pObj->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar5 + 1,Fill);
      if (((long)iVar5 < 0) || ((pAVar3->vTravIds).nSize <= iVar5)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar3->vTravIds).pArray[iVar5] = iVar1;
      if ((*(uint *)&pObj->field_0x14 & 0xf) == 7) {
        iVar5 = Abc_FlowRetime_GetLag(pObj);
        Abc_FlowRetime_SetLag(pObj,iVar5 + 1);
      }
      if (0 < (pObj->vFanouts).nSize) {
        lVar6 = 0;
        do {
          Abc_FlowRetime_UpdateLags_back_rec
                    ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar6]]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pObj->vFanouts).nSize);
      }
    }
  }
  return;
}

Assistant:

void
Abc_FlowRetime_UpdateLags_back_rec( Abc_Obj_t *pObj ) {
  Abc_Obj_t *pNext;
  int i;

  assert(!Abc_ObjIsPo(pObj));
  assert(!Abc_ObjIsLatch(pObj));

  if (Abc_ObjIsBo(pObj)) return;
  if (Abc_NodeIsTravIdCurrent(pObj)) return;

  Abc_NodeSetTravIdCurrent(pObj);

  if (Abc_ObjIsNode(pObj)) {
    Abc_FlowRetime_SetLag( pObj, 1+Abc_FlowRetime_GetLag(pObj) );
  }

  Abc_ObjForEachFanout( pObj, pNext, i ) {
    Abc_FlowRetime_UpdateLags_back_rec( pNext );
  }
}